

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O0

Operand __thiscall flow::TargetCodeGenerator::getConstantInt(TargetCodeGenerator *this,Value *value)

{
  FILE *__stream;
  undefined8 uVar1;
  long lVar2;
  long local_60;
  allocator<char> local_39;
  string local_38 [32];
  ConstantValue<long,_(flow::LiteralType)2> *local_18;
  Value *value_local;
  TargetCodeGenerator *this_local;
  
  local_18 = (ConstantValue<long,_(flow::LiteralType)2> *)value;
  value_local = (Value *)this;
  if (value == (Value *)0x0) {
    local_60 = 0;
  }
  else {
    local_60 = __dynamic_cast(value,&Value::typeinfo,
                              &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
  }
  __stream = _stderr;
  if (local_60 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,"Must be ConstantInt",&local_39);
    uVar1 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s\n",uVar1);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
    abort();
  }
  lVar2 = ConstantValue<long,_(flow::LiteralType)2>::get(local_18);
  return (Operand)lVar2;
}

Assistant:

Operand TargetCodeGenerator::getConstantInt(Value* value) {
  FLOW_ASSERT(dynamic_cast<ConstantInt*>(value) != nullptr, "Must be ConstantInt");
  return static_cast<ConstantInt*>(value)->get();
}